

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.h
# Opt level: O2

bool __thiscall
AggregateIndexes::isIncrement
          (AggregateIndexes *this,AggregateIndexes *bench,size_t *offset,bitset<7UL> *increasing)

{
  ulong uVar1;
  size_t sVar2;
  size_t i;
  ulong uVar3;
  bool bVar4;
  
  uVar3 = (this->present).super__Base_bitset<1UL>._M_w;
  if (uVar3 == (bench->present).super__Base_bitset<1UL>._M_w) {
    if (*offset == 0) {
      (increasing->super__Base_bitset<1UL>)._M_w = 0;
      for (uVar3 = 0; bVar4 = uVar3 == 7, !bVar4; uVar3 = uVar3 + 1) {
        if (((this->present).super__Base_bitset<1UL>._M_w >> (uVar3 & 0x3f) & 1) != 0) {
          if (this->indexes[uVar3] == bench->indexes[uVar3] + 1) {
            std::bitset<7UL>::set(increasing,uVar3,true);
          }
          else if (this->indexes[uVar3] != bench->indexes[uVar3]) {
            return bVar4;
          }
        }
      }
    }
    else {
      for (uVar1 = 0; bVar4 = uVar1 == 7, !bVar4; uVar1 = uVar1 + 1) {
        if ((uVar3 >> (uVar1 & 0x3f) & 1) != 0) {
          sVar2 = bench->indexes[uVar1];
          if (((increasing->super__Base_bitset<1UL>)._M_w & 1L << ((byte)uVar1 & 0x3f)) != 0) {
            sVar2 = sVar2 + *offset + 1;
          }
          if (this->indexes[uVar1] != sVar2) {
            return bVar4;
          }
        }
      }
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool isIncrement(const AggregateIndexes& bench, const size_t& offset,
                     std::bitset<7>& increasing)
    {
        if (present != bench.present)
            return false;
        
        // If offset is zero we didn't compare any two tuples yet
        if (offset==0)
        {
            // compare this and bench
            increasing.reset();
            for (size_t i = 0; i < 7; i++)
            {
                if (present[i])
                {
                    if (indexes[i] == bench.indexes[i] + 1)
                    {
                        increasing.set(i);
                    }
                    else if (indexes[i] != bench.indexes[i])
                    {
                        return false;
                    }
                }
            }
            return true;
        }
        
        for (size_t i = 0; i < 7; i++)
        {
            if (present[i])
            {
                if (increasing[i])
                {
                    if (indexes[i] != bench.indexes[i] + offset + 1)
                        return false;
                }
                else
                {
                    if (indexes[i] != bench.indexes[i])
                        return false;
                }
            }
        }
        return true;
    }